

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

void __thiscall
despot::Tag::Observe
          (Tag *this,Belief *belief,ACT_TYPE action,
          map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
          *obss)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  long lVar9;
  int i;
  ulong uVar10;
  long *plVar11;
  OBS_TYPE obs;
  
  plVar6 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  uVar8 = 0;
  while( true ) {
    if ((ulong)(plVar6[1] - *plVar6 >> 3) <= uVar8) break;
    lVar3 = *(long *)(*plVar6 + uVar8 * 8);
    iVar5 = (**(code **)(*(long *)&this->super_BaseTag + 0x58))(this,lVar3);
    plVar11 = (long *)(*(long *)&(this->super_BaseTag).transition_probabilities_.
                                 super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar5].
                                 super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                 ._M_impl.super__Vector_impl_data + (long)action * 0x18);
    lVar9 = 0x18;
    for (uVar10 = 0; lVar4 = *plVar11, uVar10 < (ulong)(plVar11[1] - lVar4 >> 5);
        uVar10 = uVar10 + 1) {
      obs = (this->obs_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[*(int *)(lVar4 + -0xc + lVar9)];
      dVar1 = *(double *)(lVar3 + 0x18);
      dVar2 = *(double *)(lVar4 + lVar9);
      pmVar7 = std::
               map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               ::operator[](obss,&obs);
      *pmVar7 = dVar1 * dVar2 + *pmVar7;
      lVar9 = lVar9 + 0x20;
    }
    uVar8 = uVar8 + 1;
  }
  return;
}

Assistant:

void Tag::Observe(const Belief* belief, ACT_TYPE action,
	map<OBS_TYPE, double>& obss) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();
	for (int i = 0; i < particles.size(); i++) {
		TagState* state = static_cast<TagState*>(particles[i]);
		const vector<State>& distribution = transition_probabilities_[GetIndex(
			state)][action];
		for (int i = 0; i < distribution.size(); i++) {
			const State& next = distribution[i];
			OBS_TYPE obs = obs_[next.state_id];
			double p = state->weight * next.weight;
			obss[obs] += p;
		}
	}
}